

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O1

Fraction operator*(Fraction *a,int *b)

{
  Fraction FVar1;
  uint __m;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  FVar1 = *a;
  uVar6 = *b * FVar1.numerator_;
  uVar5 = FVar1.denominator_;
  uVar4 = uVar5;
  if ((int)uVar5 < 1) {
    uVar4 = -uVar5;
  }
  __m = uVar6;
  if ((int)uVar6 < 1) {
    __m = -uVar6;
  }
  uVar2 = -uVar6;
  uVar3 = -uVar5;
  if (-1 < (long)FVar1) {
    uVar2 = uVar6;
    uVar3 = uVar5;
  }
  uVar4 = std::__detail::__gcd<unsigned_int>(__m,uVar4);
  return (Fraction)
         ((long)(int)uVar3 / (long)(int)uVar4 << 0x20 |
         (long)(int)uVar2 / (long)(int)uVar4 & 0xffffffffU);
}

Assistant:

Fraction operator*(const Fraction& a, const int& b) {
  Fraction current_frac = a;
  current_frac.numerator_ *= b;
  current_frac.Normalization();
  return current_frac;
}